

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O2

light_pcapng_t * light_pcapng_open_write(char *file_path,light_pcapng_file_info *file_info)

{
  light_pcapng_t *plVar1;
  light_pcapng section;
  light_option p_Var2;
  light_pcapng next_block;
  uint32_t *buf;
  ulong uVar3;
  undefined8 uVar4;
  size_t section_memory_size;
  light_pcapng local_50;
  __fd_t local_48;
  uint32_t local_40;
  undefined4 local_3c;
  undefined8 local_38;
  
  if (file_info == (light_pcapng_file_info *)0x0) {
    uVar4 = 0xcb;
  }
  else {
    if (file_path != (char *)0x0) {
      plVar1 = (light_pcapng_t *)calloc(1,0x20);
      local_48 = light_open(file_path,LIGHT_OWRITE);
      plVar1->file = local_48;
      plVar1->file_info = file_info;
      local_40 = 0x1a2b3c4d;
      local_3c._0_2_ = file_info->major_version;
      local_3c._2_2_ = file_info->minor_version;
      local_38 = 0xffffffffffffffff;
      section = light_alloc_block(0xa0d0d0a,&local_40,0x1c);
      plVar1->pcapng = section;
      if (file_info->file_comment_size != 0) {
        p_Var2 = light_create_option(1,(uint16_t)file_info->file_comment_size,
                                     file_info->file_comment);
        light_add_option(section,section,p_Var2,LIGHT_FALSE);
      }
      if (file_info->hardware_desc_size != 0) {
        p_Var2 = light_create_option(2,(uint16_t)file_info->hardware_desc_size,
                                     file_info->hardware_desc);
        light_add_option(section,section,p_Var2,LIGHT_FALSE);
      }
      if (file_info->os_desc_size != 0) {
        p_Var2 = light_create_option(3,(uint16_t)file_info->os_desc_size,file_info->os_desc);
        light_add_option(section,section,p_Var2,LIGHT_FALSE);
      }
      if (file_info->user_app_desc_size != 0) {
        p_Var2 = light_create_option(4,(uint16_t)file_info->user_app_desc_size,
                                     file_info->user_app_desc);
        light_add_option(section,section,p_Var2,LIGHT_FALSE);
      }
      plVar1->pcapng_iter = section;
      local_50 = section;
      for (uVar3 = 0; uVar3 < file_info->interface_block_count; uVar3 = uVar3 + 1) {
        section_memory_size = (size_t)file_info->link_types[uVar3];
        next_block = light_alloc_block(1,(uint32_t *)&section_memory_size,0x14);
        light_add_block(section,next_block);
        plVar1->pcapng_iter = next_block;
        section = next_block;
      }
      section_memory_size = 0;
      buf = light_pcapng_to_memory(local_50,&section_memory_size);
      light_write(local_48,buf,section_memory_size);
      free(buf);
      return plVar1;
    }
    uVar4 = 0xcc;
  }
  fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
          ,"light_pcapng_open_write",uVar4);
  return (light_pcapng_t *)0x0;
}

Assistant:

light_pcapng_t *light_pcapng_open_write(const char* file_path, light_pcapng_file_info *file_info)
{
	DCHECK_NULLP(file_info, return NULL);
	DCHECK_NULLP(file_path, return NULL);

	light_pcapng_t *pcapng = calloc(1, sizeof(struct _light_pcapng_t));
	pcapng->file = light_open(file_path, LIGHT_OWRITE);
	pcapng->file_info = file_info;

	struct _light_section_header section_header;
	section_header.byteorder_magic = BYTE_ORDER_MAGIC;
	section_header.major_version = file_info->major_version;
	section_header.minor_version = file_info->minor_version;
	section_header.section_length = 0xFFFFFFFFFFFFFFFFULL;
	pcapng->pcapng = light_alloc_block(LIGHT_SECTION_HEADER_BLOCK, (const uint32_t*)&section_header, sizeof(section_header)+3*sizeof(uint32_t));

	if (file_info->file_comment_size > 0)
	{
		light_option new_opt = light_create_option(LIGHT_OPTION_COMMENT, file_info->file_comment_size, file_info->file_comment);
		light_add_option(pcapng->pcapng, pcapng->pcapng, new_opt, LIGHT_FALSE);
	}

	if (file_info->hardware_desc_size > 0)
	{
		light_option new_opt = light_create_option(LIGHT_OPTION_SHB_HARDWARE, file_info->hardware_desc_size, file_info->hardware_desc);
		light_add_option(pcapng->pcapng, pcapng->pcapng, new_opt, LIGHT_FALSE);
	}

	if (file_info->os_desc_size > 0)
	{
		light_option new_opt = light_create_option(LIGHT_OPTION_SHB_OS, file_info->os_desc_size, file_info->os_desc);
		light_add_option(pcapng->pcapng, pcapng->pcapng, new_opt, LIGHT_FALSE);
	}

	if (file_info->user_app_desc_size > 0)
	{
		light_option new_opt = light_create_option(LIGHT_OPTION_SHB_USERAPPL, file_info->user_app_desc_size, file_info->user_app_desc);
		light_add_option(pcapng->pcapng, pcapng->pcapng, new_opt, LIGHT_FALSE);
	}

	pcapng->pcapng_iter = pcapng->pcapng;
	int i = 0;
	for (i = 0; i < file_info->interface_block_count; i++)
	{
		struct _light_interface_description_block interface_block;
		interface_block.link_type = file_info->link_types[i];
		interface_block.reserved = 0;
		interface_block.snapshot_length = 0;

		light_pcapng iface_block_pcapng = light_alloc_block(LIGHT_INTERFACE_BLOCK, (const uint32_t*)&interface_block, sizeof(struct _light_interface_description_block)+3*sizeof(uint32_t));
		light_add_block(pcapng->pcapng_iter, iface_block_pcapng);
		pcapng->pcapng_iter = iface_block_pcapng;
	}

	size_t section_memory_size = 0;
	uint32_t *file_memory = light_pcapng_to_memory(pcapng->pcapng, &section_memory_size);
	light_write(pcapng->file, file_memory, section_memory_size);
	free(file_memory);

	return pcapng;
}